

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_PlaneSurface::Trim(ON_PlaneSurface *this,int dir,ON_Interval *domain)

{
  bool bVar1;
  double *pdVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double x1;
  double x0;
  double local_60;
  undefined1 local_58 [8];
  ON_Interval trim_extents;
  ON_Interval trim_domain;
  ON_Interval current_domain;
  ON_Interval *domain_local;
  int dir_local;
  ON_PlaneSurface *this_local;
  
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = false;
  }
  else {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    trim_domain.m_t[1] = extraout_XMM0_Qa;
    pdVar2 = ON_Interval::operator[]((ON_Interval *)(trim_domain.m_t + 1),0);
    if ((*pdVar2 == -1.23432101234321e+308) && (!NAN(*pdVar2))) {
      pdVar2 = ON_Interval::operator[]((ON_Interval *)(trim_domain.m_t + 1),1);
      if ((*pdVar2 == -1.23432101234321e+308) && (!NAN(*pdVar2))) {
        trim_domain.m_t[1] = domain->m_t[0];
      }
    }
    dVar3 = -1.23432101234321e+308;
    ON_Interval::ON_Interval((ON_Interval *)(trim_extents.m_t + 1));
    local_58 = *(undefined1 (*) [8])(&this->field_0xb0 + (long)dir * 0x10);
    trim_extents.m_t[0] = *(double *)((long)(&this->field_0xb0 + (long)dir * 0x10) + 8);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this,(ulong)(uint)dir);
    local_60 = dVar3;
    ON_Interval::Intersection((ON_Interval *)(trim_extents.m_t + 1),domain,(ON_Interval *)&x0);
    bVar1 = ON_Interval::IsIncreasing((ON_Interval *)(trim_extents.m_t + 1));
    if (bVar1) {
      bVar1 = ON_Interval::operator==
                        ((ON_Interval *)(&this->field_0x90 + (long)dir * 0x10),
                         (ON_Interval *)(&this->field_0xb0 + (long)dir * 0x10));
      if (bVar1) {
        local_58 = (undefined1  [8])trim_extents.m_t[1];
        trim_extents.m_t[0] = trim_domain.m_t[0];
      }
      else {
        pdVar2 = ON_Interval::operator[]((ON_Interval *)(trim_extents.m_t + 1),0);
        dVar3 = ON_Interval::NormalizedParameterAt
                          ((ON_Interval *)(&this->field_0x90 + (long)dir * 0x10),*pdVar2);
        dVar3 = ON_Interval::ParameterAt
                          ((ON_Interval *)(&this->field_0xb0 + (long)dir * 0x10),dVar3);
        pdVar2 = ON_Interval::operator[]((ON_Interval *)(trim_extents.m_t + 1),1);
        dVar4 = ON_Interval::NormalizedParameterAt
                          ((ON_Interval *)(&this->field_0x90 + (long)dir * 0x10),*pdVar2);
        dVar4 = ON_Interval::ParameterAt
                          ((ON_Interval *)(&this->field_0xb0 + (long)dir * 0x10),dVar4);
        ON_Interval::Set((ON_Interval *)local_58,dVar3,dVar4);
      }
      bVar1 = ON_Interval::IsIncreasing((ON_Interval *)local_58);
      if (bVar1) {
        *(undefined1 (*) [8])(&this->field_0xb0 + (long)dir * 0x10) = local_58;
        *(double *)((long)(&this->field_0xb0 + (long)dir * 0x10) + 8) = trim_extents.m_t[0];
        *(double *)(&this->field_0x90 + (long)dir * 0x10) = trim_extents.m_t[1];
        *(double *)((long)(&this->field_0x90 + (long)dir * 0x10) + 8) = trim_domain.m_t[0];
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PlaneSurface::Trim(
       int dir,
       const ON_Interval& domain
       )
{
  if ( dir < 0 || dir > 1 )
    return false;
  ON_Interval current_domain = Domain(dir);
  if ( current_domain[0] == ON_UNSET_VALUE && current_domain[1] == ON_UNSET_VALUE )
    current_domain = domain;
  ON_Interval trim_domain, trim_extents = m_extents[dir];
  trim_domain.Intersection(domain, Domain(dir) );
  if ( !trim_domain.IsIncreasing() )
    return false;
  if ( m_domain[dir] == m_extents[dir] )
    trim_extents = trim_domain;
  else
  {
    double x0 = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt( trim_domain[0] ) );
    double x1 = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt( trim_domain[1] ) );
    trim_extents.Set(x0,x1);
  }
  if ( !trim_extents.IsIncreasing() )
    return false;
  m_extents[dir] = trim_extents;
  m_domain[dir] = trim_domain;
  return true;
}